

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImPool<ImGuiTabBar>::~ImPool(ImPool<ImGuiTabBar> *this)

{
  ImPool<ImGuiTabBar> *in_RDI;
  
  Clear(in_RDI);
  ImGuiStorage::~ImGuiStorage((ImGuiStorage *)0x142458);
  ImVector<ImGuiTabBar>::~ImVector(&in_RDI->Buf);
  return;
}

Assistant:

~ImPool()   { Clear(); }